

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_absorb(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RCX;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  bVar1 = is_affected(in_RCX,(int)gsn_absorb);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    init_affect((AFFECT_DATA *)0x6e15d4);
    iVar2 = dice(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (AFFECT_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff68));
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
        (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
        (void *)CONCAT44(iVar2,in_stack_ffffffffffffff68),0);
  }
  return;
}

Assistant:

void spell_absorb(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, gsn_absorb))
	{
		send_to_char("You are already absorbing electricity.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_absorb;
	af.level = level;
	af.duration = dice(4, 2) + level / 4;
	af.modifier = 0;
	af.location = 0;
	affect_to_char(victim, &af);

	send_to_char("Warmth fills your body as you attune yourself to channel raw lightning.\n\r", victim);
	act("Flashes of light illuminate $N's eyes for a moment as $E completes the spell.", ch, nullptr, victim, TO_ROOM);
}